

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cc
# Opt level: O0

string * __thiscall
phosg::format_time_abi_cxx11_(string *__return_storage_ptr__,phosg *this,uint64_t t)

{
  char *pcVar1;
  size_type sVar2;
  runtime_error *prVar3;
  unsigned_long *puVar4;
  size_type local_90;
  unsigned_long local_88;
  int local_7c;
  size_t sStack_78;
  int usecs_ret;
  size_t len;
  allocator<char> local_5a;
  undefined1 local_59;
  undefined1 local_58 [8];
  tm t_parsed;
  time_t t_secs;
  uint64_t t_local;
  string *ret;
  
  t_parsed.tm_zone = (char *)((ulong)this / 1000000);
  gmtime_r((time_t *)&t_parsed.tm_zone,(tm *)local_58);
  local_59 = 0;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,0x80,'\0',&local_5a);
  ::std::allocator<char>::~allocator(&local_5a);
  pcVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     (__return_storage_ptr__);
  sVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (__return_storage_ptr__);
  sStack_78 = strftime(pcVar1,sVar2,"%Y-%m-%d %H:%M:%S",(tm *)local_58);
  if (sStack_78 == 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar3,"format_time buffer too short");
    __cxa_throw(prVar3,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  pcVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     (__return_storage_ptr__);
  pcVar1 = pcVar1 + sStack_78;
  sVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (__return_storage_ptr__);
  local_7c = snprintf(pcVar1,sVar2 - sStack_78,".%06u",(ulong)this % 1000000);
  if (-1 < local_7c) {
    local_88 = sStack_78 + (long)local_7c;
    local_90 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               size(__return_storage_ptr__);
    puVar4 = ::std::min<unsigned_long>(&local_88,&local_90);
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              (__return_storage_ptr__,*puVar4);
    return __return_storage_ptr__;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(prVar3,"cannot add microsecond field");
  __cxa_throw(prVar3,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string format_time(uint64_t t) {
  time_t t_secs = t / 1000000;
  struct tm t_parsed;
  gmtime_r(&t_secs, &t_parsed);

  string ret(128, 0);
  size_t len = strftime(ret.data(), ret.size(), "%Y-%m-%d %H:%M:%S", &t_parsed);
  if (len == 0) {
    throw runtime_error("format_time buffer too short");
  }
  int usecs_ret = snprintf(ret.data() + len, ret.size() - len, ".%06" PRIu32, static_cast<uint32_t>(t % 1000000));
  if (usecs_ret < 0) {
    throw runtime_error("cannot add microsecond field");
  }
  ret.resize(min<size_t>(len + usecs_ret, ret.size()));
  return ret;
}